

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

int __thiscall ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,double *B,double *pivot)

{
  double **ppdVar1;
  double dVar2;
  int local_6c;
  int n;
  double **this_m;
  int rank;
  int ix;
  int k;
  int i;
  double piv;
  double x;
  double t;
  double *pivot_local;
  double *B_local;
  double zero_tolerance_local;
  ON_Matrix *this_local;
  
  ppdVar1 = ThisM(this);
  _k = 0.0;
  this_m._0_4_ = 0;
  if (this->m_col_count < this->m_row_count) {
    local_6c = this->m_col_count;
  }
  else {
    local_6c = this->m_row_count;
  }
  for (rank = 0; rank < local_6c; rank = rank + 1) {
    this_m._4_4_ = rank;
    piv = ABS(ppdVar1[rank][rank]);
    ix = rank;
    while (ix = ix + 1, ix < this->m_row_count) {
      if (piv < ABS(ppdVar1[ix][rank])) {
        this_m._4_4_ = ix;
        piv = ABS(ppdVar1[ix][rank]);
      }
    }
    if ((piv < _k) || (rank == 0)) {
      _k = piv;
    }
    if (piv <= zero_tolerance) break;
    this_m._0_4_ = (int)this_m + 1;
    if (this_m._4_4_ != rank) {
      SwapRows(this,this_m._4_4_,rank);
      dVar2 = B[this_m._4_4_];
      B[this_m._4_4_] = B[rank];
      B[rank] = dVar2;
    }
    dVar2 = ppdVar1[rank][rank];
    ppdVar1[rank][rank] = 1.0;
    ON_ArrayScale((this->m_col_count + -1) - rank,1.0 / dVar2,ppdVar1[rank] + (rank + 1),
                  ppdVar1[rank] + (rank + 1));
    B[rank] = (1.0 / dVar2) * B[rank];
    ix = rank;
    while (ix = ix + 1, ix < this->m_row_count) {
      dVar2 = -ppdVar1[ix][rank];
      ppdVar1[ix][rank] = 0.0;
      if (zero_tolerance < ABS(dVar2)) {
        ON_Array_aA_plus_B((this->m_col_count + -1) - rank,dVar2,ppdVar1[rank] + (rank + 1),
                           ppdVar1[ix] + (rank + 1),ppdVar1[ix] + (rank + 1));
        B[ix] = dVar2 * B[rank] + B[ix];
      }
    }
  }
  if (pivot != (double *)0x0) {
    *pivot = _k;
  }
  return (int)this_m;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    double* B,
    double* pivot 
    )
{
  double t;
  double x, piv;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    if ( ix != k )
    {
      // swap rows of matrix and B
      SwapRows( ix, k );
      t = B[ix]; B[ix] = B[k]; B[k] = t;
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
    B[k] *= x;

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        B[i] += x*B[k];
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  return rank;
}